

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O3

string * __thiscall
Diligent::BasicFileSystem::SimplifyPath_abi_cxx11_
          (string *__return_storage_ptr__,BasicFileSystem *this,Char *Path,Char Slash)

{
  BasicFileSystem BVar1;
  bool bVar2;
  int iVar3;
  BasicFileSystem *pBVar4;
  pointer pMVar5;
  ulong uVar6;
  pointer pMVar7;
  undefined7 in_register_00000009;
  MiniStringView *Cmp;
  long lVar8;
  ulong uVar9;
  char (*Args_1) [31];
  BasicFileSystem BVar10;
  ulong uVar11;
  pointer pMVar12;
  char *pcVar13;
  BasicFileSystem *pBVar14;
  char (*pacVar15) [31];
  char cVar16;
  size_t __n;
  long lVar17;
  _Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *p_Var18;
  pointer pMVar19;
  char **ppcVar20;
  string msg;
  pointer local_78;
  pointer local_70;
  string local_50;
  
  Cmp = (MiniStringView *)CONCAT71(in_register_00000009,Slash);
  if (this == (BasicFileSystem *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","",Cmp);
    return __return_storage_ptr__;
  }
  cVar16 = (char)Path;
  pBVar14 = this;
  if (cVar16 == '\0') {
    cVar16 = '/';
  }
  else if ((cVar16 != '/') && (cVar16 != '\\')) {
    FormatString<char[23]>(&local_50,(char (*) [23])"Incorrect slash symbol");
    pcVar13 = "SimplifyPath";
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SimplifyPath",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
               ,0xea);
    pBVar14 = (BasicFileSystem *)pcVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      pBVar14 = (BasicFileSystem *)(local_50.field_2._M_allocated_capacity + 1);
      operator_delete(local_50._M_dataplus._M_p,(ulong)pBVar14);
    }
  }
  pBVar4 = this + 1;
  p_Var18 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)0x1;
  do {
    BVar1 = pBVar4[-1];
    if ((BVar1 == (BasicFileSystem)0x2f) || (BVar1 == (BasicFileSystem)0x5c)) {
      p_Var18 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)
                ((long)&(p_Var18->_M_impl).super__Vector_impl_data._M_start +
                (ulong)(*pBVar4 != (BasicFileSystem)0x5c && *pBVar4 != (BasicFileSystem)0x2f));
    }
    else if (BVar1 == (BasicFileSystem)0x0) break;
    pBVar4 = pBVar4 + 1;
  } while( true );
  if ((ulong)p_Var18 >> 0x3b != 0) {
    std::__throw_length_error("vector::reserve");
  }
  if (p_Var18 == (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)0x0) {
    pMVar5 = (pointer)0x0;
    pMVar19 = (pointer)0x0;
  }
  else {
    pMVar5 = std::_Vector_base<MiniStringView,_std::allocator<MiniStringView>_>::_M_allocate
                       (p_Var18,(size_t)pBVar14);
    pMVar19 = pMVar5 + (long)p_Var18;
  }
  BVar1 = *this;
  pBVar14 = this;
  pMVar7 = pMVar5;
  local_78 = pMVar5;
  local_70 = pMVar5;
  while (BVar1 != (BasicFileSystem)0x0) {
    while ((BVar1 == (BasicFileSystem)0x2f || (BVar1 == (BasicFileSystem)0x5c))) {
      pBVar4 = pBVar14 + 1;
      pBVar14 = pBVar14 + 1;
      BVar1 = *pBVar4;
    }
    if (BVar1 == (BasicFileSystem)0x0) break;
    lVar8 = 0;
    BVar10 = BVar1;
    while (((BVar10 != (BasicFileSystem)0x0 && (BVar10 != (BasicFileSystem)0x2f)) &&
           (BVar10 != (BasicFileSystem)0x5c))) {
      lVar17 = lVar8 + 1;
      lVar8 = lVar8 + 1;
      BVar10 = pBVar14[lVar17];
    }
    pBVar4 = pBVar14 + lVar8;
    if (lVar8 == 2) {
      if (((BVar1 == (BasicFileSystem)0x2e) && (pBVar14[1] == (BasicFileSystem)0x2e)) &&
         (local_78 != pMVar7)) {
        pMVar5 = pMVar7 + -1;
        __n = (long)pMVar7[-1].End - (long)pMVar7[-1].Start;
        iVar3 = strncmp("..",pMVar7[-1].Start,__n);
        pMVar12 = pMVar5;
        if ((iVar3 != 0) || (".."[__n] != '\0')) goto LAB_0051c354;
      }
LAB_0051c262:
      if (pMVar7 == pMVar19) {
        uVar11 = (long)pMVar19 - (long)local_78;
        if (uVar11 == 0x7ffffffffffffff0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar6 = (long)uVar11 >> 4;
        uVar9 = uVar6;
        if (pMVar19 == local_78) {
          uVar9 = 1;
        }
        p_Var18 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)(uVar9 + uVar6);
        if ((_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)0x7fffffffffffffe <
            p_Var18) {
          p_Var18 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)
                    0x7ffffffffffffff;
        }
        if (CARRY8(uVar9,uVar6)) {
          p_Var18 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)
                    0x7ffffffffffffff;
        }
        local_70 = std::_Vector_base<MiniStringView,_std::allocator<MiniStringView>_>::_M_allocate
                             (p_Var18,0x7ffffffffffffff);
        *(BasicFileSystem **)((long)local_70 + uVar11) = pBVar14;
        *(BasicFileSystem **)((long)local_70 + uVar11 + 8) = pBVar4;
        pMVar5 = local_70;
        for (pMVar7 = local_78; pMVar19 != pMVar7; pMVar7 = pMVar7 + 1) {
          pcVar13 = pMVar7->End;
          pMVar5->Start = pMVar7->Start;
          pMVar5->End = pcVar13;
          pMVar5 = pMVar5 + 1;
        }
        if (local_78 != (pointer)0x0) {
          operator_delete(local_78,uVar11);
        }
        pMVar5 = pMVar5 + 1;
        pMVar19 = local_70 + (long)p_Var18;
        pMVar12 = pMVar5;
        local_78 = local_70;
      }
      else {
        pMVar7->Start = (char *)pBVar14;
        pMVar7->End = (char *)pBVar4;
        pMVar5 = pMVar7 + 1;
        pMVar12 = pMVar5;
      }
    }
    else if ((lVar8 != 1) || (pMVar12 = pMVar7, BVar1 != (BasicFileSystem)0x2e)) goto LAB_0051c262;
LAB_0051c354:
    pBVar14 = pBVar4;
    pMVar7 = pMVar12;
    BVar1 = *pBVar4;
  }
  if (cVar16 == '/') {
    bVar2 = *this == (BasicFileSystem)0x5c || *this == (BasicFileSystem)0x2f;
  }
  else {
    bVar2 = false;
  }
  lVar8 = (long)pMVar5 - (long)local_70 >> 4;
  pcVar13 = (char *)(ulong)bVar2;
  for (pMVar7 = local_70; pMVar7 != pMVar5; pMVar7 = pMVar7 + 1) {
    pcVar13 = pMVar7->End + ((long)pcVar13 - (long)pMVar7->Start);
  }
  Args_1 = (char (*) [31])0x0;
  pacVar15 = (char (*) [31])(lVar8 + -1);
  if (local_70 == pMVar5) {
    pacVar15 = Args_1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if ((char *)(ulong)bVar2 != (char *)0x0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  if (local_70 != pMVar5) {
    ppcVar20 = &local_70->End;
    lVar17 = 0;
    do {
      if (lVar17 != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      Args_1 = (char (*) [31])((MiniStringView *)(ppcVar20 + -1))->Start;
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
                 (ulong)Args_1);
      lVar17 = lVar17 + 1;
      ppcVar20 = ppcVar20 + 2;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar17);
  }
  if ((char *)__return_storage_ptr__->_M_string_length != *pacVar15 + (long)pcVar13) {
    FormatString<char[26],char[31]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SimplifiedPath.length() == Len",Args_1);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SimplifyPath",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
               ,0x11b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_70 != (pointer)0x0) {
    operator_delete(local_70,(long)pMVar19 - (long)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BasicFileSystem::SimplifyPath(const Char* Path, Char Slash)
{
    if (Path == nullptr)
        return "";

    if (Slash != 0)
        DEV_CHECK_ERR(IsSlash(Slash), "Incorrect slash symbol");
    else
        Slash = SlashSymbol;

    struct MiniStringView
    {
        MiniStringView(const char* _Start,
                       const char* _End) :
            Start{_Start},
            End{_End}
        {}

        bool operator==(const char* Str) const noexcept
        {
            const auto Len = End - Start;
            return strncmp(Str, Start, Len) == 0 && Str[Len] == '\0';
        }

        bool operator!=(const char* str) const noexcept
        {
            return !(*this == str);
        }

        const char* const Start;
        const char* const End;
    };

    const auto PathComponents  = Diligent::SplitPath<MiniStringView>(Path, true);
    const auto NumComponents   = PathComponents.size();
    const auto UseLeadingSlash = Slash == '/' && IsSlash(Path[0]);

    size_t Len = UseLeadingSlash ? 1 : 0;
    for (const auto& Cmp : PathComponents)
        Len += Cmp.End - Cmp.Start;
    if (NumComponents > 0)
        Len += NumComponents - 1;

    std::string SimplifiedPath;
    SimplifiedPath.reserve(Len);
    if (UseLeadingSlash)
        SimplifiedPath.push_back(Slash);

    for (size_t i = 0; i < NumComponents; ++i)
    {
        if (i > 0)
            SimplifiedPath.push_back(Slash);
        const auto& Cmp = PathComponents[i];
        SimplifiedPath.append(Cmp.Start, Cmp.End);
    }
    VERIFY_EXPR(SimplifiedPath.length() == Len);

    return SimplifiedPath;
}